

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_utils.hpp
# Opt level: O2

int parse_utils::parse_memory(string *memory)

{
  int iVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  if ((memory->_M_dataplus)._M_p[memory->_M_string_length - 1] == 'm') {
    std::__cxx11::string::pop_back();
    std::__cxx11::string::string((string *)&local_30,(string *)memory);
    iVar1 = obj_utils::string_to_int(&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    return iVar1 << 0x14;
  }
  std::operator+(&local_50,"error flag memory: ",memory);
  poVar2 = std::operator<<((ostream *)&std::cerr,(string *)&local_50);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_50);
  poVar2 = std::operator<<((ostream *)&std::cerr,"please use flag \'--memory 10m\' ");
  std::endl<char,std::char_traits<char>>(poVar2);
  exit(-1);
}

Assistant:

static int parse_memory(std::string memory) {
    if (memory.back() != 'm') {
      std::cerr << "error flag memory: " + memory << std::endl;
      std::cerr << "please use flag '--memory 10m' " << std::endl;
      exit(-1);
    }
    memory.pop_back();
    return obj_utils::string_to_int(memory) << 20;
  }